

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dept.h
# Opt level: O0

void __thiscall Department::print(Department *this,string *group_id,int day_id)

{
  bool bVar1;
  ostream *poVar2;
  mapped_type *this_00;
  reference __p;
  undefined1 local_d8 [8];
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
  element;
  iterator __end2;
  iterator __begin2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
  *__range2;
  int day_id_local;
  string *group_id_local;
  Department *this_local;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"dept_id: ");
  poVar2 = std::operator<<(poVar2,(string *)this);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  bVar1 = std::operator!=(group_id,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)default_group_abi_cxx11_);
  if (bVar1) {
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                            *)(this + 0x20),group_id);
    Group::print(this_00,day_id);
  }
  else {
    __end2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                      *)(this + 0x20));
    element.second.lesson_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
         (size_t)std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                 ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>_>
                        *)(this + 0x20));
    while (bVar1 = std::operator!=(&__end2,(_Self *)&element.second.lesson_set._M_t._M_impl.
                                                     super__Rb_tree_header._M_node_count), bVar1) {
      __p = std::
            _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>
            ::operator*(&__end2);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group,_true>
                ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
                  *)local_d8,__p);
      Group::print((Group *)&element.field_0x18,day_id);
      std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>::
      ~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>
             *)local_d8);
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Group>_>
      ::operator++(&__end2);
    }
  }
  return;
}

Assistant:

void Department::print(std::string group_id, int day_id) {

    //print a group
    std::cout << "dept_id: " << deptNumber << std::endl;
    if (group_id != default_group) {
        groups[group_id].print(day_id);
    }
    //print all groups
    else {

        for (std::pair<std::string, Group> element : groups) {
            element.second.print(day_id);
            std::cout << std::endl;
        }
    }

}